

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O0

ASYNC_OPERATION_HANDLE
amqp_management_execute_operation_async
          (AMQP_MANAGEMENT_HANDLE amqp_management,char *operation,char *type,char *locales,
          MESSAGE_HANDLE message,
          ON_AMQP_MANAGEMENT_EXECUTE_OPERATION_COMPLETE on_execute_operation_complete,
          void *on_execute_operation_complete_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  ASYNC_OPERATION_HANDLE pAVar3;
  LIST_ITEM_HANDLE item;
  ASYNC_OPERATION_HANDLE pAVar4;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LIST_ITEM_HANDLE added_item;
  OPERATION_MESSAGE_INSTANCE *pending_operation_message;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  MESSAGE_HANDLE cloned_message;
  AMQP_VALUE application_properties;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  ASYNC_OPERATION_HANDLE result;
  ON_AMQP_MANAGEMENT_EXECUTE_OPERATION_COMPLETE on_execute_operation_complete_local;
  MESSAGE_HANDLE message_local;
  char *locales_local;
  char *type_local;
  char *operation_local;
  AMQP_MANAGEMENT_HANDLE amqp_management_local;
  
  result = (ASYNC_OPERATION_HANDLE)on_execute_operation_complete;
  on_execute_operation_complete_local = (ON_AMQP_MANAGEMENT_EXECUTE_OPERATION_COMPLETE)message;
  message_local = (MESSAGE_HANDLE)locales;
  locales_local = type;
  type_local = operation;
  operation_local = (char *)amqp_management;
  if ((((amqp_management == (AMQP_MANAGEMENT_HANDLE)0x0) || (operation == (char *)0x0)) ||
      (type == (char *)0x0)) ||
     (on_execute_operation_complete == (ON_AMQP_MANAGEMENT_EXECUTE_OPERATION_COMPLETE)0x0)) {
    l_1 = xlogging_get_log_function();
    if (l_1 != (LOGGER_LOG)0x0) {
      (*l_1)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
             ,"amqp_management_execute_operation_async",0x494,1,
             "Bad arguments: amqp_management = %p, operation = %p, type = %p",operation_local,
             type_local,locales_local);
    }
    l = (LOGGER_LOG)0x0;
  }
  else if ((amqp_management->amqp_management_state == AMQP_MANAGEMENT_STATE_IDLE) ||
          (amqp_management->amqp_management_state == AMQP_MANAGEMENT_STATE_ERROR)) {
    application_properties = (AMQP_VALUE)xlogging_get_log_function();
    if (application_properties != (AMQP_VALUE)0x0) {
      (*(code *)application_properties)
                (0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                 ,"amqp_management_execute_operation_async",0x49c,1,
                 "amqp_management_execute_operation_async called while not open or in error");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    if (message == (MESSAGE_HANDLE)0x0) {
      l_2 = (LOGGER_LOG)message_create();
    }
    else {
      l_2 = (LOGGER_LOG)message_clone(message);
      if (((MESSAGE_HANDLE)l_2 == (MESSAGE_HANDLE)0x0) &&
         (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                  ,"amqp_management_execute_operation_async",0x4af,1,"Could not clone message");
      }
    }
    if (l_2 == (LOGGER_LOG)0x0) {
      l = (LOGGER_LOG)0x0;
    }
    else {
      iVar1 = message_get_application_properties((MESSAGE_HANDLE)l_2,(AMQP_VALUE *)&cloned_message);
      if (iVar1 == 0) {
        if (((cloned_message == (MESSAGE_HANDLE)0x0) &&
            (cloned_message = (MESSAGE_HANDLE)amqpvalue_create_map(),
            cloned_message == (MESSAGE_HANDLE)0x0)) &&
           (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                    ,"amqp_management_execute_operation_async",0x4c8,1,
                    "Could not create application properties");
        }
        if (cloned_message == (MESSAGE_HANDLE)0x0) {
          l = (LOGGER_LOG)0x0;
        }
        else {
          iVar1 = add_string_key_value_pair_to_map
                            ((AMQP_VALUE)cloned_message,"operation",type_local);
          if (((iVar1 == 0) &&
              (iVar1 = add_string_key_value_pair_to_map
                                 ((AMQP_VALUE)cloned_message,"type",locales_local), iVar1 == 0)) &&
             ((message_local == (MESSAGE_HANDLE)0x0 ||
              (iVar1 = add_string_key_value_pair_to_map
                                 ((AMQP_VALUE)cloned_message,"locales",(char *)message_local),
              iVar1 == 0)))) {
            iVar1 = message_set_application_properties
                              ((MESSAGE_HANDLE)l_2,(AMQP_VALUE)cloned_message);
            if (iVar1 == 0) {
              iVar1 = set_message_id((MESSAGE_HANDLE)l_2,*(uint64_t *)(operation_local + 0x28));
              if (iVar1 == 0) {
                pAVar3 = async_operation_create(amqp_management_execute_cancel_handler,0x40);
                l = (LOGGER_LOG)pAVar3;
                if (pAVar3 == (ASYNC_OPERATION_HANDLE)0x0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                              ,"amqp_management_execute_operation_async",0x4f2,1,
                              "Failed allocating async result");
                  }
                }
                else {
                  pAVar3[2].async_operation_cancel_handler =
                       (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)on_execute_operation_complete_context;
                  pAVar3[1].async_operation_cancel_handler =
                       (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)result;
                  pAVar3[3].async_operation_cancel_handler =
                       *(ASYNC_OPERATION_CANCEL_HANDLER_FUNC *)(operation_local + 0x28);
                  pAVar3[5].async_operation_cancel_handler =
                       (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)operation_local;
                  *(undefined1 *)&pAVar3[4].async_operation_cancel_handler = 0;
                  pAVar3[7].async_operation_cancel_handler =
                       (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)pAVar3;
                  item = singlylinkedlist_add
                                   (*(SINGLYLINKEDLIST_HANDLE *)(operation_local + 0x20),pAVar3 + 1)
                  ;
                  if (item == (LIST_ITEM_HANDLE)0x0) {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                                ,"amqp_management_execute_operation_async",0x505,1,
                                "Could not add the operation to the pending operations list.");
                    }
                    async_operation_destroy((ASYNC_OPERATION_HANDLE)l);
                    l = (LOGGER_LOG)0x0;
                  }
                  else {
                    pAVar4 = messagesender_send_async
                                       (*(MESSAGE_SENDER_HANDLE *)(operation_local + 0x10),
                                        (MESSAGE_HANDLE)l_2,on_message_send_complete,item,0);
                    pAVar3[6].async_operation_cancel_handler =
                         (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)pAVar4;
                    if (pAVar3[6].async_operation_cancel_handler ==
                        (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0) {
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                                  ,"amqp_management_execute_operation_async",0x511,1,
                                  "Could not send request message");
                      }
                      singlylinkedlist_remove
                                (*(SINGLYLINKEDLIST_HANDLE *)(operation_local + 0x20),item);
                      async_operation_destroy((ASYNC_OPERATION_HANDLE)l);
                      l = (LOGGER_LOG)0x0;
                    }
                    else {
                      *(long *)(operation_local + 0x28) = *(long *)(operation_local + 0x28) + 1;
                    }
                  }
                }
              }
              else {
                l = (LOGGER_LOG)0x0;
              }
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                          ,"amqp_management_execute_operation_async",0x4e5,1,
                          "Could not set application properties");
              }
              l = (LOGGER_LOG)0x0;
            }
          }
          else {
            l = (LOGGER_LOG)0x0;
          }
          amqpvalue_destroy((AMQP_VALUE)cloned_message);
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                    ,"amqp_management_execute_operation_async",0x4bd,1,
                    "Could not get application properties");
        }
        l = (LOGGER_LOG)0x0;
      }
      message_destroy((MESSAGE_HANDLE)l_2);
    }
  }
  return (ASYNC_OPERATION_HANDLE)l;
}

Assistant:

ASYNC_OPERATION_HANDLE amqp_management_execute_operation_async(AMQP_MANAGEMENT_HANDLE amqp_management, const char* operation, const char* type, const char* locales, MESSAGE_HANDLE message, ON_AMQP_MANAGEMENT_EXECUTE_OPERATION_COMPLETE on_execute_operation_complete, void* on_execute_operation_complete_context)
{
    ASYNC_OPERATION_HANDLE result;
    
    if ((amqp_management == NULL) ||
        (operation == NULL) ||
        (type == NULL) ||
        (on_execute_operation_complete == NULL))
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_057: [ If `amqp_management`, `operation`, `type` or `on_execute_operation_complete` is NULL, `amqp_management_execute_operation_async` shall fail and return NULL. ]*/
        LogError("Bad arguments: amqp_management = %p, operation = %p, type = %p",
            amqp_management, operation, type);
        result = NULL;
    }
    /* Codes_SRS_AMQP_MANAGEMENT_01_081: [ If `amqp_management_execute_operation_async` is called when not OPEN, it shall fail and return NULL. ]*/
    else if ((amqp_management->amqp_management_state == AMQP_MANAGEMENT_STATE_IDLE) ||
        /* Codes_SRS_AMQP_MANAGEMENT_01_104: [ If `amqp_management_execute_operation_async` is called when the AMQP management is in error, it shall fail and return a non-zero value. ]*/
        (amqp_management->amqp_management_state == AMQP_MANAGEMENT_STATE_ERROR))
    {
        LogError("amqp_management_execute_operation_async called while not open or in error");
        result = NULL;
    }
    else
    {
        AMQP_VALUE application_properties;
        MESSAGE_HANDLE cloned_message;

        if (message == NULL)
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_102: [ If `message` is NULL, a new message shall be created by calling `message_create`. ]*/
            cloned_message = message_create();
        }
        else
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_103: [ Otherwise the existing message shall be cloned by using `message_clone` before being modified accordingly and used for the pending operation. ]*/
            cloned_message = message_clone(message);
            if (cloned_message == NULL)
            {
                LogError("Could not clone message");
            }
        }

        if (cloned_message == NULL)
        {
            result = NULL;
        }
        else
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_055: [ `amqp_management_execute_operation_async` shall start an AMQP management operation. ]*/
            /* Codes_SRS_AMQP_MANAGEMENT_01_082: [ `amqp_management_execute_operation_async` shall obtain the application properties from the message by calling `message_get_application_properties`. ]*/
            if (message_get_application_properties(cloned_message, &application_properties) != 0)
            {
                LogError("Could not get application properties");
                result = NULL;
            }
            else
            {
                if (application_properties == NULL)
                {
                    /* Codes_SRS_AMQP_MANAGEMENT_01_083: [ If no application properties were set on the message, a new application properties instance shall be created by calling `amqpvalue_create_map`; ]*/
                    application_properties = amqpvalue_create_map();
                    if (application_properties == NULL)
                    {
                        LogError("Could not create application properties");
                    }
                }

                if (application_properties == NULL)
                {
                    result = NULL;
                }
                else
                {
                    /* Codes_SRS_AMQP_MANAGEMENT_01_084: [ For each of the arguments `operation`, `type` and `locales` an AMQP value of type string shall be created by calling `amqpvalue_create_string` in order to be used as key in the application properties map. ]*/
                    /* Codes_SRS_AMQP_MANAGEMENT_01_085: [ For each of the arguments `operation`, `type` and `locales` an AMQP value of type string containing the argument value shall be created by calling `amqpvalue_create_string` in order to be used as value in the application properties map. ]*/
                    /* Codes_SRS_AMQP_MANAGEMENT_01_058: [ Request messages have the following application-properties: ]*/
                    /* Codes_SRS_AMQP_MANAGEMENT_01_059: [ operation string Yes The management operation to be performed. ] */
                    if ((add_string_key_value_pair_to_map(application_properties, "operation", operation) != 0) ||
                        /* Codes_SRS_AMQP_MANAGEMENT_01_061: [ type string Yes The Manageable Entity Type of the Manageable Entity to be managed. ]*/
                        (add_string_key_value_pair_to_map(application_properties, "type", type) != 0) ||
                        /* Codes_SRS_AMQP_MANAGEMENT_01_093: [ If `locales` is NULL, no key/value pair shall be added for it in the application properties map. ]*/
                        /* Codes_SRS_AMQP_MANAGEMENT_01_063: [ locales string No A list of locales that the sending peer permits for incoming informational text in response messages. ]*/
                        ((locales != NULL) && (add_string_key_value_pair_to_map(application_properties, "locales", locales) != 0)))
                    {
                        result = NULL;
                    }
                    else
                    {
                        /* Codes_SRS_AMQP_MANAGEMENT_01_087: [ The application properties obtained after adding the key/value pairs shall be set on the message by calling `message_set_application_properties`. ]*/
                        if (message_set_application_properties(cloned_message, application_properties) != 0)
                        {
                            /* Codes_SRS_AMQP_MANAGEMENT_01_090: [ If any APIs used to create and set the application properties on the message fails, `amqp_management_execute_operation_async` shall fail and return NULL. ]*/
                            LogError("Could not set application properties");
                            result = NULL;
                        }
                        else if (set_message_id(cloned_message, amqp_management->next_message_id) != 0)
                        {
                            result = NULL;
                        }
                        else
                        {
                            result = CREATE_ASYNC_OPERATION(OPERATION_MESSAGE_INSTANCE, amqp_management_execute_cancel_handler);

                            if (result == NULL)
                            {
                                LogError("Failed allocating async result");
                            }
                            else
                            {
                                OPERATION_MESSAGE_INSTANCE* pending_operation_message = GET_ASYNC_OPERATION_CONTEXT(OPERATION_MESSAGE_INSTANCE, result);

                                LIST_ITEM_HANDLE added_item;
                                pending_operation_message->callback_context = on_execute_operation_complete_context;
                                pending_operation_message->on_execute_operation_complete = on_execute_operation_complete;
                                pending_operation_message->message_id = amqp_management->next_message_id;
                                pending_operation_message->amqp_management = amqp_management;
                                pending_operation_message->message_send_confirmed = false;
                                pending_operation_message->execute_async_operation = result;

                                /* Codes_SRS_AMQP_MANAGEMENT_01_091: [ Once the request message has been sent, an entry shall be stored in the pending operations list by calling `singlylinkedlist_add`. ]*/
                                added_item = singlylinkedlist_add(amqp_management->pending_operations, pending_operation_message);
                                if (added_item == NULL)
                                {
                                    /* Codes_SRS_AMQP_MANAGEMENT_01_092: [ If `singlylinkedlist_add` fails then `amqp_management_execute_operation_async` shall fail and return a non-zero value. ]*/
                                    LogError("Could not add the operation to the pending operations list.");
                                    async_operation_destroy(result);
                                    result = NULL;
                                }
                                else
                                {
                                    /* Codes_SRS_AMQP_MANAGEMENT_01_088: [ `amqp_management_execute_operation_async` shall send the message by calling `messagesender_send_async`. ]*/
                                    /* Codes_SRS_AMQP_MANAGEMENT_01_166: [ The `on_message_send_complete` callback shall be passed to the `messagesender_send_async` call. ]*/
                                    pending_operation_message->send_async_context = messagesender_send_async(amqp_management->message_sender, cloned_message, on_message_send_complete, added_item, 0);
                                    if (pending_operation_message->send_async_context == NULL)
                                    {
                                        /* Codes_SRS_AMQP_MANAGEMENT_01_089: [ If `messagesender_send_async` fails, `amqp_management_execute_operation_async` shall fail and return NULL. ]*/
                                        LogError("Could not send request message");
                                        (void)singlylinkedlist_remove(amqp_management->pending_operations, added_item);
                                        async_operation_destroy(result);
                                        result = NULL;
                                    }
                                    else
                                    {
                                        /* Codes_SRS_AMQP_MANAGEMENT_01_107: [ The message Id set on the message properties shall be incremented with each operation. ]*/
                                        amqp_management->next_message_id++;
                                    }
                                }
                            }
                        }
                    }

                    /* Codes_SRS_AMQP_MANAGEMENT_01_101: [ After setting the application properties, the application properties instance shall be freed by `amqpvalue_destroy`. ]*/
                    amqpvalue_destroy(application_properties);
                }
            }

            message_destroy(cloned_message);
        }
    }
    return result;
}